

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O0

void __thiscall
dxil_spv::SPIRVModule::Impl::register_builtin_shader_input(Impl *this,Id id,BuiltIn builtin)

{
  mapped_type mVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  mapped_type local_18;
  Id local_14;
  BuiltIn builtin_local;
  Id id_local;
  Impl *this_local;
  
  local_18 = builtin;
  local_14 = id;
  _builtin_local = this;
  pmVar2 = std::
           unordered_map<spv::BuiltIn,_unsigned_int,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_dxil_spv::ThreadLocalAllocator<std::pair<const_spv::BuiltIn,_unsigned_int>_>_>
           ::operator[](&this->builtins_input,&local_18);
  mVar1 = local_18;
  *pmVar2 = id;
  pmVar3 = std::
           unordered_map<unsigned_int,_spv::BuiltIn,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_spv::BuiltIn>_>_>
           ::operator[](&this->id_to_builtin_input,&local_14);
  *pmVar3 = mVar1;
  return;
}

Assistant:

void SPIRVModule::Impl::register_builtin_shader_input(spv::Id id, spv::BuiltIn builtin)
{
	builtins_input[builtin] = id;
	id_to_builtin_input[id] = builtin;
}